

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extract_tar_gz.c
# Opt level: O3

void test_extract_tar_gz(void)

{
  wchar_t wVar1;
  
  extract_reference_file("test_extract.tar.gz");
  wVar1 = systemf("%s -tf %s >test.out 2>test.err",testprog,"test_extract.tar.gz");
  if (wVar1 != L'\0') {
    wVar1 = canGzip();
    if (wVar1 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_gz.c"
                     ,L'.');
      test_skipping("It seems gzip is not supported on this platform");
      return;
    }
  }
  wVar1 = systemf("%s -xf %s >test.out 2>test.err",testprog,"test_extract.tar.gz");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_gz.c"
                      ,L'%',0,"0",(long)wVar1,
                      "systemf(\"%s -xf %s >test.out 2>test.err\", testprog, reffile)",(void *)0x0);
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_gz.c"
             ,L'\'',"file1");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_gz.c"
             ,L'(',"contents of file1.\n","file1");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_gz.c"
             ,L')',"file2");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_gz.c"
             ,L'*',"contents of file2.\n","file2");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_gz.c"
             ,L'+',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_extract_tar_gz.c"
             ,L',',"test.err");
  return;
}

Assistant:

DEFINE_TEST(test_extract_tar_gz)
{
	const char *reffile = "test_extract.tar.gz";
	int f;

	extract_reference_file(reffile);
	f = systemf("%s -tf %s >test.out 2>test.err", testprog, reffile);
	if (f == 0 || canGzip()) {
		assertEqualInt(0, systemf("%s -xf %s >test.out 2>test.err",
		    testprog, reffile));

		assertFileExists("file1");
		assertTextFileContents("contents of file1.\n", "file1");
		assertFileExists("file2");
		assertTextFileContents("contents of file2.\n", "file2");
		assertEmptyFile("test.out");
		assertEmptyFile("test.err");
	} else {
		skipping("It seems gzip is not supported on this platform");
	}
}